

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O0

bool __thiscall cmCursesStringWidget::PrintKeys(cmCursesStringWidget *this)

{
  int local_38;
  int local_34;
  undefined2 local_23;
  undefined1 local_21;
  int local_20;
  int iStack_1c;
  char fmt_s [3];
  int y;
  int x;
  cmCursesStringWidget *this_local;
  
  if (_stdscr == 0) {
    local_34 = -1;
  }
  else {
    local_34 = *(short *)(_stdscr + 4) + 1;
  }
  local_20 = local_34;
  if (_stdscr == 0) {
    local_38 = -1;
  }
  else {
    local_38 = *(short *)(_stdscr + 6) + 1;
  }
  iStack_1c = local_38;
  if ((local_38 < 0x41) || (local_34 < 6)) {
    this_local._7_1_ = false;
  }
  else if (((this->super_cmCursesWidget).field_0x3c & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_23 = 0x7325;
    local_21 = 0;
    curses_move(local_34 - 4,0);
    wclrtoeol(_stdscr);
    curses_move(local_20 - 3,0);
    printw(&local_23);
    wclrtoeol(_stdscr);
    curses_move(local_20 - 2,0);
    printw(&local_23);
    wclrtoeol(_stdscr);
    curses_move(local_20 - 1,0);
    wclrtoeol(_stdscr);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCursesStringWidget::PrintKeys()
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    return false;
  }
  if (this->InEdit) {
    char fmt_s[] = "%s";
    // Clean the toolbar
    curses_move(y - 4, 0);
    clrtoeol();
    curses_move(y - 3, 0);
    printw(fmt_s, "Editing option, press [enter] to confirm");
    clrtoeol();
    curses_move(y - 2, 0);
    printw(fmt_s, "                press [esc] to cancel");
    clrtoeol();
    curses_move(y - 1, 0);
    clrtoeol();

    return true;
  }
  return false;
}